

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Wrap.c
# Opt level: O2

void XUtf8DrawString(Display *display,Drawable d,XUtf8FontStruct *font_set,GC gc,int x,int y,
                    char *string,int num_bytes)

{
  int iVar1;
  int *piVar2;
  XFontStruct **ppXVar3;
  GC p_Var4;
  Display *pDVar5;
  unsigned_short uVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint ucs_00;
  long lVar10;
  long lVar11;
  char glyph [2];
  int local_19c;
  uint ucs;
  ulong local_188;
  long local_180;
  int local_174;
  GC local_170;
  Display *local_168;
  Drawable local_160;
  long local_158;
  uint local_14c;
  uchar *local_148;
  int *local_140;
  XChar2b buf [128];
  
  iVar1 = font_set->nb_font;
  lVar11 = (long)iVar1;
  if (0 < lVar11) {
    local_140 = font_set->ranges;
    piVar2 = font_set->encodings;
    ppXVar3 = font_set->fonts;
    for (lVar10 = 0; lVar11 != lVar10; lVar10 = lVar10 + 1) {
      if (ppXVar3[lVar10] != (XFontStruct *)0x0) {
        uVar9 = 0;
        local_19c = x;
        local_170 = gc;
        local_168 = display;
        local_160 = d;
        local_158 = lVar10;
        do {
          pDVar5 = local_168;
          p_Var4 = local_170;
          iVar7 = (int)lVar10;
          local_180 = (long)iVar7;
          if (num_bytes < 1) {
            XSetFont(local_168,local_170,ppXVar3[local_180]->fid);
            XDrawString16(pDVar5,local_160,p_Var4,local_19c,y,buf,(int)uVar9);
            return;
          }
          lVar10 = local_158;
          local_188 = uVar9;
          local_174 = iVar7;
          local_148 = (uchar *)string;
          if (0x78 < (int)uVar9) {
            XSetFont(local_168,local_170,ppXVar3[local_180]->fid);
            lVar10 = local_158;
            XDrawString16(pDVar5,local_160,p_Var4,local_19c,y,buf,(int)local_188);
            iVar7 = XTextWidth16(ppXVar3[local_180],buf,local_188);
            local_19c = local_19c + iVar7;
            local_188 = 0;
          }
          local_14c = XFastConvertUtf8ToUcs(local_148,num_bytes,&ucs);
          if ((int)local_14c < 2) {
            local_14c = 1;
          }
          uVar6 = XUtf8IsNonSpacing(ucs);
          ucs_00 = ucs;
          if (uVar6 != 0) {
            ucs = (uint)uVar6;
            ucs_00 = (uint)uVar6;
          }
          for (; lVar11 != lVar10; lVar10 = lVar10 + 1) {
            if (ppXVar3[lVar10] != (XFontStruct *)0x0) {
              iVar7 = piVar2[lVar10];
              iVar8 = ucs2fontmap(glyph,ucs_00,iVar7);
              if ((-1 < iVar8) &&
                 ((iVar7 != 0 ||
                  ((local_140[lVar10 * 2] <= (int)ucs_00 &&
                   ((int)ucs_00 <= local_140[lVar10 * 2 + 1])))))) {
                if (iVar1 != (int)lVar10) goto LAB_001a6c9e;
                break;
              }
            }
          }
          lVar10 = local_158;
          ucs2fontmap(glyph,0x3f,piVar2[local_158]);
LAB_001a6c9e:
          pDVar5 = local_168;
          if ((uVar6 == 0) && (local_174 == (int)lVar10)) {
            buf[(int)local_188].byte1 = glyph[0];
            buf[(int)local_188].byte2 = glyph[1];
            uVar9 = (ulong)((int)local_188 + 1);
          }
          else {
            XSetFont(local_168,local_170,ppXVar3[local_180]->fid);
            XDrawString16(pDVar5,local_160,local_170,local_19c,y,buf,(int)local_188);
            iVar7 = XTextWidth16(ppXVar3[local_180],buf,local_188);
            local_19c = local_19c + iVar7;
            buf[0].byte1 = glyph[0];
            buf[0].byte2 = glyph[1];
            if (uVar6 == 0) {
              uVar9 = 1;
            }
            else {
              iVar7 = XTextWidth16(ppXVar3[(int)lVar10],buf,1);
              local_19c = local_19c - iVar7;
              uVar9 = 1;
            }
          }
          string = (char *)(local_148 + local_14c);
          num_bytes = num_bytes - local_14c;
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void
XUtf8DrawString(Display 	*display,
	        Drawable 	d,
                XUtf8FontStruct *font_set,
	        GC 		gc,
	        int 		x,
	        int 		y,
	        const char	*string,
                int 		num_bytes) {

  int 		*encodings; /* encodings array */
  XFontStruct 	**fonts;    /* fonts array */
  Fl_XChar2b 	buf[128];   /* drawing buffer */
  int 		fnum;       /* index of the current font in the fonts array*/
  int 		i;          /* current byte in the XChar2b buffer */
  int 		first;      /* first valid font index */
  int 		last_fnum;  /* font index of the previous char */
  int 		nb_font;    /* quantity of fonts in the font array */
  char 		glyph[2];   /* byte1 and byte2 value of the UTF-8 char */
  int		*ranges;    /* sub range of iso10646 */

  nb_font = font_set->nb_font;

  if (nb_font < 1) {
    /* there is no font in the font_set :-( */
    return;
  }
  ranges = font_set->ranges;
  fonts = font_set->fonts;
  encodings = font_set->encodings;
  i = 0;
  fnum = 0;

  while(fnum < nb_font && !fonts[fnum]) fnum++;
  if (fnum >= nb_font) {
    /* there is no valid font for the X server */
    return;
  }

  first = fnum;
  last_fnum = fnum;

  while (num_bytes > 0) {
    int 	 ulen;   /* byte length of the UTF-8 char */
    unsigned int ucs;    /* Unicode value of the UTF-8 char */
    unsigned int no_spc; /* Spacing char equivalent of a non-spacing char */

    if (i > 120) {
      /*** draw the buffer **/
      XSetFont(display, gc, fonts[fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[fnum], buf, i);
      i = 0;
    }

    ulen = XFastConvertUtf8ToUcs((const unsigned char*)string, num_bytes, &ucs);

    if (ulen < 1) ulen = 1;

    no_spc = XUtf8IsNonSpacing(ucs);
    if (no_spc) ucs = no_spc;

    /*
     * find the first encoding which can be used to
     * draw the glyph
     */
    fnum = first;
    while (fnum < nb_font) {
      if (fonts[fnum] && ucs2fontmap(glyph, ucs, encodings[fnum]) >= 0) {
	if (encodings[fnum] != 0 ||
	    ((int)ucs >= ranges[fnum * 2] &&
	     (int)ucs <= ranges[fnum * 2 + 1])) {
	  break;
	}
      }
      fnum++;
    }
    if (fnum == nb_font) {
      /* the char is not valid in all encodings ->
       * draw it using the first font :-(
       */
      fnum = first;
      ucs2fontmap(glyph, '?', encodings[fnum]);
    }

    if (last_fnum != fnum || no_spc) {
      XSetFont(display, gc, fonts[last_fnum]->fid);
      XDrawString16(display, d, gc, x, y, buf, i);
      x += XTextWidth16(fonts[last_fnum], buf, i);
      i = 0;
      (*buf).byte1 = glyph[0];
      (*buf).byte2 = glyph[1];
      if (no_spc) {
	x -= XTextWidth16(fonts[fnum], buf, 1);
      }
    } else {
      (*(buf + i)).byte1 = glyph[0];
      (*(buf + i)).byte2 = glyph[1];
    }
    last_fnum = fnum;
    i++;
    string += ulen;
    num_bytes -= ulen;
  }

  XSetFont(display, gc, fonts[fnum]->fid);
  XDrawString16(display, d, gc, x, y, buf, i);
}